

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

void __thiscall CVmObjIterIdx::mark_refs(CVmObjIterIdx *this,uint state)

{
  vm_val_t coll;
  uint in_stack_ffffffffffffffd8;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  get_coll_val((CVmObjIterIdx *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (vm_val_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (in_stack_ffffffffffffffe0 == 5) {
    CVmObjTable::mark_all_refs
              ((CVmObjTable *)CONCAT44(in_stack_ffffffffffffffe4,5),in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void CVmObjIterIdx::mark_refs(VMG_ uint state)
{
    vm_val_t coll;
    
    /* if my collection is an object, mark it as referenced */
    get_coll_val(&coll);
    if (coll.typ == VM_OBJ)
        G_obj_table->mark_all_refs(coll.val.obj, state);
}